

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen.cc
# Opt level: O2

void __thiscall absl::lts_20250127::random_internal::Randen::Randen(Randen *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  
  if (random_internal::(anonymous_namespace)::GetRandenState()::state != '\0') goto LAB_002da8d2;
  iVar3 = __cxa_guard_acquire(&random_internal::(anonymous_namespace)::GetRandenState()::state);
  if (iVar3 == 0) goto LAB_002da8d2;
  bVar2 = HasRandenHwAesImplementation();
  if (bVar2) {
    bVar2 = CPUSupportsRandenHwAes();
    if (!bVar2) goto LAB_002da915;
    random_internal::(anonymous_namespace)::GetRandenState()::state = RandenHwAes::GetKeys();
    DAT_00554218 = 1;
  }
  else {
LAB_002da915:
    random_internal::(anonymous_namespace)::GetRandenState()::state = RandenSlow::GetKeys();
    DAT_00554218 = 0;
  }
  __cxa_guard_release(&random_internal::(anonymous_namespace)::GetRandenState()::state);
LAB_002da8d2:
  bVar1 = DAT_00554218;
  this->keys_ = random_internal::(anonymous_namespace)::GetRandenState()::state;
  this->has_crypto_ = (bool)(bVar1 & 1);
  return;
}

Assistant:

Randen::Randen() {
  auto tmp = GetRandenState();
  keys_ = tmp.keys;
#if ABSL_RANDOM_INTERNAL_AES_DISPATCH
  has_crypto_ = tmp.has_crypto;
#endif
}